

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regeximpl.h
# Opt level: O2

bool __thiscall YAML::RegEx::Matches<YAML::StringCharSource>(RegEx *this,StringCharSource *source)

{
  int iVar1;
  
  iVar1 = Match<YAML::StringCharSource>(this,source);
  return -1 < iVar1;
}

Assistant:

inline bool RegEx::Matches(const Source& source) const {
  return Match(source) >= 0;
}